

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPCnOut.cpp
# Opt level: O3

bool __thiscall NaPetriCnOutput::is_waiting(NaPetriCnOutput *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->nPrCnt;
  iVar2 = (*(this->super_NaPetriConnector)._vptr_NaPetriConnector[2])();
  return iVar1 != iVar2;
}

Assistant:

bool
NaPetriCnOutput::is_waiting ()
{
    //!// Allow to increase nPrCnt more than links number, so one-node
    //!// loop become accepted
    //!// if(nPrCnt >= links()){
    if(nPrCnt == links()){
        // Data can be released
        return false;
    }
    return true;
}